

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DCFGReader.cpp
# Opt level: O3

void __thiscall DCFGReader::readImages(DCFGReader *this,json *array)

{
  bool bVar1;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *piVar2;
  reference pbVar3;
  reference pvVar4;
  int file_id;
  iterator result;
  iterator it2;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_c0;
  Addr local_a0;
  int local_94;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_70;
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_50;
  
  if (array->m_type != array) {
    __assert_fail("array.is_array()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                  ,0xd9,"void DCFGReader::readImages(json &)");
  }
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity = 0;
  local_90.field_2._8_8_ = 0x8000000000000000;
  local_90._M_dataplus._M_p = (pointer)array;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_begin((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)&local_90);
  piVar2 = nlohmann::detail::
           iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         *)&local_90);
  local_70.m_object = piVar2->m_object;
  local_70.m_it.primitive_iterator.m_it = (piVar2->m_it).primitive_iterator.m_it;
  local_70.m_it.object_iterator._M_node = (piVar2->m_it).object_iterator._M_node;
  local_70.m_it.array_iterator._M_current = (piVar2->m_it).array_iterator._M_current;
  local_c0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_c0.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_c0.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_c0.m_object = array;
  nlohmann::detail::
  iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  ::set_end(&local_c0);
  local_50.m_object = local_c0.m_object;
  local_50.m_it.object_iterator._M_node = local_c0.m_it.object_iterator._M_node;
  local_50.m_it.array_iterator._M_current = local_c0.m_it.array_iterator._M_current;
  local_50.m_it.primitive_iterator.m_it = local_c0.m_it.primitive_iterator.m_it;
  bVar1 = nlohmann::detail::
          iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_70,&local_50);
  if (!bVar1) {
    do {
      pbVar3 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*(&local_70);
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(pbVar3,1);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_90,pvVar4);
      local_a0 = str2addr(&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      pbVar3 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*(&local_70);
      pvVar4 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::at(pbVar3,3);
      if (pvVar4->m_type != object) {
        __assert_fail("idata.is_object()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                      ,0xdf,"void DCFGReader::readImages(json &)");
      }
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[13]>((iterator *)&local_90,pvVar4,(char (*) [13])"FILE_NAME_ID");
      local_c0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_c0.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)0x0;
      local_c0.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_c0.m_object = pvVar4;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::set_end(&local_c0);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_90,&local_c0);
      if (bVar1) {
        __assert_fail("it2 != idata.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/DCFGReader.cpp"
                      ,0xe2,"void DCFGReader::readImages(json &)");
      }
      pbVar3 = nlohmann::detail::
               iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_90);
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pbVar3,(int *)&local_c0);
      local_94 = (int)local_c0.m_object;
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[13]>(&local_c0,pvVar4,(char (*) [13])"BASIC_BLOCKS");
      local_90._M_dataplus._M_p = (pointer)local_c0.m_object;
      local_90.field_2._8_8_ = local_c0.m_it.primitive_iterator.m_it;
      local_90._M_string_length = (size_type)local_c0.m_it.object_iterator._M_node;
      local_90.field_2._M_allocated_capacity = (size_type)local_c0.m_it.array_iterator._M_current;
      local_c0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_c0.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)0x0;
      local_c0.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_c0.m_object = pvVar4;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::set_end(&local_c0);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_90,&local_c0);
      if (!bVar1) {
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_90);
        readBasicBlocks(this,local_a0,pbVar3);
      }
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[9]>(&local_c0,pvVar4,(char (*) [9])"ROUTINES");
      local_90._M_dataplus._M_p = (pointer)local_c0.m_object;
      local_90.field_2._8_8_ = local_c0.m_it.primitive_iterator.m_it;
      local_90._M_string_length = (size_type)local_c0.m_it.object_iterator._M_node;
      local_90.field_2._M_allocated_capacity = (size_type)local_c0.m_it.array_iterator._M_current;
      local_c0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_c0.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)0x0;
      local_c0.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_c0.m_object = pvVar4;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::set_end(&local_c0);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_90,&local_c0);
      if (!bVar1) {
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_90);
        readRoutines(this,pbVar3);
      }
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[8]>(&local_c0,pvVar4,(char (*) [8])"SYMBOLS");
      local_90._M_dataplus._M_p = (pointer)local_c0.m_object;
      local_90.field_2._8_8_ = local_c0.m_it.primitive_iterator.m_it;
      local_90._M_string_length = (size_type)local_c0.m_it.object_iterator._M_node;
      local_90.field_2._M_allocated_capacity = (size_type)local_c0.m_it.array_iterator._M_current;
      local_c0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_c0.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)0x0;
      local_c0.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_c0.m_object = pvVar4;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::set_end(&local_c0);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_90,&local_c0);
      if (!bVar1) {
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_90);
        readSymbols(this,local_94,local_a0,pbVar3);
      }
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::find<char_const(&)[12]>(&local_c0,pvVar4,(char (*) [12])"SOURCE_DATA");
      local_90._M_dataplus._M_p = (pointer)local_c0.m_object;
      local_90.field_2._8_8_ = local_c0.m_it.primitive_iterator.m_it;
      local_90._M_string_length = (size_type)local_c0.m_it.object_iterator._M_node;
      local_90.field_2._M_allocated_capacity = (size_type)local_c0.m_it.array_iterator._M_current;
      local_c0.m_it.object_iterator._M_node = (_Base_ptr)0x0;
      local_c0.m_it.array_iterator._M_current =
           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            *)0x0;
      local_c0.m_it.primitive_iterator.m_it = -0x8000000000000000;
      local_c0.m_object = pvVar4;
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::set_end(&local_c0);
      piVar2 = &local_c0;
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            *)&local_90,&local_c0);
      file_id = (int)piVar2;
      if (!bVar1) {
        pbVar3 = nlohmann::detail::
                 iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_90);
        readSourceData(this,file_id,local_a0,pbVar3);
      }
      nlohmann::detail::
      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
      ::operator++(&local_70);
      bVar1 = nlohmann::detail::
              iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              ::operator==(&local_70,&local_50);
    } while (!bVar1);
  }
  return;
}

Assistant:

void DCFGReader::readImages(json& array) {
	json::iterator it, ed;

	assert(array.is_array());

	for (it = ++(array.begin()), ed = array.end(); it != ed; ++it) {
		Addr baseAddr = str2addr((*it).at(1));

		json& idata = (*it).at(3);
		assert(idata.is_object());

		json::iterator it2 = idata.find("FILE_NAME_ID");
		assert(it2 != idata.end());
		int file_id = it2.value();

		it2 = idata.find("BASIC_BLOCKS");
		if (it2 != idata.end())
			readBasicBlocks(baseAddr, it2.value());

		it2 = idata.find("ROUTINES");
		if (it2 != idata.end())
			readRoutines(it2.value());

		it2 = idata.find("SYMBOLS");
		if (it2 != idata.end())
			readSymbols(file_id, baseAddr, it2.value());

		it2 = idata.find("SOURCE_DATA");
		if (it2 != idata.end())
			readSourceData(file_id, baseAddr, it2.value());
	}
}